

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O1

bool __thiscall miniros::RPCManager::start(RPCManager *this,int port)

{
  bool bVar1;
  string *psVar2;
  ostream *poVar3;
  socklen_t in_ECX;
  stringstream ss;
  sockaddr local_1d8;
  code *local_1c8;
  code *pcStack_1c0;
  thread local_1b0;
  RPCManager *local_1a8;
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [7];
  ios_base local_120 [264];
  
  if ((this->server_thread_)._M_id._M_thread == 0) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (start(int)::loc.initialized_ == false) {
      local_1a0._0_8_ = local_1a0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"miniros.RPCManager","");
      console::initializeLogLocation(&start(int)::loc,(string *)local_1a0,Info);
      if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
        operator_delete((void *)local_1a0._0_8_,local_190[0]._M_allocated_capacity + 1);
      }
    }
    if (start(int)::loc.level_ != Info) {
      start();
    }
    if (start(int)::loc.logger_enabled_ == true) {
      start((RPCManager *)(ulong)(uint)port);
    }
    LOCK();
    (this->shutting_down_)._M_base._M_i = false;
    UNLOCK();
    local_1a0._0_8_ = local_1a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"getPid","");
    local_1d8.sa_data[6] = '\0';
    local_1d8.sa_data[7] = '\0';
    local_1d8.sa_data[8] = '\0';
    local_1d8.sa_data[9] = '\0';
    local_1d8.sa_data[10] = '\0';
    local_1d8.sa_data[0xb] = '\0';
    local_1d8.sa_data[0xc] = '\0';
    local_1d8.sa_data[0xd] = '\0';
    local_1d8._0_8_ = getPid;
    pcStack_1c0 = std::
                  _Function_handler<void_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&),_void_(*)(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&)>
                  ::_M_invoke;
    local_1c8 = std::
                _Function_handler<void_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&),_void_(*)(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&)>
                ::_M_manager;
    bind(this,(int)local_1a0,&local_1d8,in_ECX);
    if (local_1c8 != (code *)0x0) {
      (*local_1c8)(&local_1d8,&local_1d8,3);
    }
    if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
      operator_delete((void *)local_1a0._0_8_,local_190[0]._M_allocated_capacity + 1);
    }
    bVar1 = XmlRpc::XmlRpcServer::bindAndListen(&this->server_,port,5);
    if (bVar1) {
      this->port_ = (this->server_)._port;
      std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1a0 + 0x10),"http://",7);
      psVar2 = network::getHost_abi_cxx11_();
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)(local_1a0 + 0x10),(psVar2->_M_dataplus)._M_p,
                          psVar2->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,this->port_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/",1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)this,(string *)&local_1d8);
      if ((code **)local_1d8._0_8_ != &local_1c8) {
        operator_delete((void *)local_1d8._0_8_,(ulong)(local_1c8 + 1));
      }
      local_1d8._0_8_ = serverThreadFunc;
      local_1d8.sa_data[6] = '\0';
      local_1d8.sa_data[7] = '\0';
      local_1d8.sa_data[8] = '\0';
      local_1d8.sa_data[9] = '\0';
      local_1d8.sa_data[10] = '\0';
      local_1d8.sa_data[0xb] = '\0';
      local_1d8.sa_data[0xc] = '\0';
      local_1d8.sa_data[0xd] = '\0';
      local_1a8 = this;
      std::thread::thread<void(miniros::RPCManager::*)(),miniros::RPCManager*,void>
                (&local_1b0,(offset_in_RPCManager_to_subr *)&local_1d8,&local_1a8);
      if ((this->server_thread_)._M_id._M_thread != 0) {
        std::terminate();
      }
      (this->server_thread_)._M_id._M_thread = (native_handle_type)local_1b0._M_id._M_thread;
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base(local_120);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  else {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (start::loc.initialized_ == false) {
      local_1a0._0_8_ = local_1a0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"miniros.RPCManager","");
      console::initializeLogLocation(&start::loc,(string *)local_1a0,Info);
      if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
        operator_delete((void *)local_1a0._0_8_,local_190[0]._M_allocated_capacity + 1);
      }
    }
    if (start::loc.level_ != Info) {
      start();
    }
    bVar1 = true;
    if (start::loc.logger_enabled_ == true) {
      start(this);
    }
  }
  return bVar1;
}

Assistant:

bool RPCManager::start(int port)
{
  if (server_thread_.joinable()) {
    MINIROS_INFO("Manager is running at port %d", port_);
    return true;
  }

  MINIROS_INFO("Starting manager at port %d", port);
  shutting_down_ = false;
  bind("getPid", getPid);

  if (!server_.bindAndListen(port))
    return false;

  port_ = server_.get_port();
  MINIROS_ASSERT(port_ != 0);

  std::stringstream ss;
  ss << "http://" << network::getHost() << ":" << port_ << "/";
  uri_ = ss.str();

  server_thread_ = std::thread(&RPCManager::serverThreadFunc, this);
  return true;
}